

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O1

Plot * plotBars<Result<unsigned_int,double>>
                 (Plot *__return_storage_ptr__,
                 vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                 *rs,function<double_(const_Result<unsigned_int,_double>_&)> *valueFunc,
                 storage_t sizePercent,string *title,string *yLabel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Plot *pPVar3;
  pointer pRVar4;
  DrawSpecs *pDVar5;
  long lVar6;
  ulong uVar7;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  storage_range_t sVar8;
  vector<double,_std::allocator<double>_> y;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  string local_120;
  Plot *local_100;
  vector<double,_std::allocator<double>_> local_f8;
  double local_d8;
  undefined8 uStack_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  _Any_data local_68;
  code *local_58;
  undefined1 local_48 [16];
  
  local_100 = (Plot *)sizePercent;
  std::function<double_(const_Result<unsigned_int,_double>_&)>::function
            ((function<double_(const_Result<unsigned_int,_double>_&)> *)&local_68,valueFunc);
  sVar8 = calculateMedianRange<Result<unsigned_int,double>>
                    (rs,(function<double_(const_Result<unsigned_int,_double>_&)> *)&local_68,
                     (storage_t)local_100);
  local_d8 = sVar8.first;
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = sVar8.second;
  local_48._12_4_ = in_XMM1_Dd;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  sciplot::Plot::Plot(__return_storage_ptr__);
  local_100 = __return_storage_ptr__;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_88,local_80 + (long)local_88)
  ;
  sciplot::AxisLabelSpecs::text(&__return_storage_ptr__->m_xlabel,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_120.field_2._M_allocated_capacity._4_2_,
                                      local_120.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  (__return_storage_ptr__->m_legend).super_ShowSpecsOf<sciplot::LegendSpecs>.m_show = false;
  std::__cxx11::string::_M_replace
            ((ulong)&(__return_storage_ptr__->m_xtics_major_bottom).
                     super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>.m_rotate,0,
             (char *)(__return_storage_ptr__->m_xtics_major_bottom).
                     super_TicsSpecsBaseOf<sciplot::TicsSpecsMajor>.m_rotate._M_string_length,
             0x18e4ab);
  sciplot::LineSpecsOf<sciplot::BorderSpecs>::lineWidth
            (&(__return_storage_ptr__->m_border).super_LineSpecsOf<sciplot::BorderSpecs>,1);
  pcVar2 = (yLabel->_M_dataplus)._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + yLabel->_M_string_length);
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_a8,local_a0 + (long)local_a8)
  ;
  sciplot::AxisLabelSpecs::text(&__return_storage_ptr__->m_ylabel,&local_120);
  uVar7 = -(ulong)((double)local_48._0_8_ - local_d8 == 0.0);
  local_d8 = (double)(~uVar7 & local_48._0_8_ | (ulong)(local_d8 + 1.0) & uVar7);
  uStack_d0 = local_48._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_120.field_2._M_allocated_capacity._4_2_,
                                      local_120.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  sciplot::Plot::yrange(__return_storage_ptr__,0.0,local_d8);
  sciplot::Plot::boxWidthRelative(__return_storage_ptr__,0.75);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  pRVar4 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((rs->
      super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_c8,(value_type *)((long)&(pRVar4->description)._M_dataplus._M_p + lVar6));
      if ((valueFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      local_120._M_dataplus._M_p =
           (pointer)(*valueFunc->_M_invoker)
                              ((_Any_data *)valueFunc,
                               (Result<unsigned_int,_double> *)
                               ((long)&(((rs->
                                         super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->suiteName).
                                       _M_dataplus._M_p + lVar6));
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_120);
      }
      else {
        *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_120._M_dataplus._M_p;
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar7 = uVar7 + 1;
      pRVar4 = (rs->
               super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x120;
    } while (uVar7 < (ulong)(((long)(rs->
                                    super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 5)
                            * -0x71c71c71c71c71c7));
  }
  pPVar3 = local_100;
  local_120.field_2._M_allocated_capacity._0_4_ = 0x65786f62;
  local_120.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_120._M_string_length = 5;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  pDVar5 = sciplot::Plot::
           drawWithVecs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                     (local_100,&local_120,&local_c8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_120.field_2._M_allocated_capacity._4_2_,
                                      local_120.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(pDVar5->super_FillSpecsOf<sciplot::DrawSpecs>).m_fillmode,0,
             (char *)(pDVar5->super_FillSpecsOf<sciplot::DrawSpecs>).m_fillmode._M_string_length,
             0x18d04d);
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return pPVar3;
}

Assistant:

sciplot::Plot plotBars(const std::vector<ResultT>& rs, std::function<typename ResultT::storage_t(const ResultT&)> valueFunc, typename ResultT::storage_t sizePercent, const std::string& title, const std::string& yLabel)
{
    auto rangePercent = calculateMedianRange(rs, valueFunc, sizePercent);
    rangePercent.second = rangePercent.second - rangePercent.first == 0 ? rangePercent.first + 1 : rangePercent.second;
    const auto& fr = rs.front();
    sciplot::Plot p;
    p.tics();
    p.xlabel("");
    p.legend().hide();
    p.xtics().rotate();
    // p.legend().title(title);
    p.border().lineWidth(1);
    p.ylabel(yLabel);
    p.yrange(0, rangePercent.second);
    p.boxWidthRelative(0.75F);
    std::vector<std::string> x;
    std::vector<typename ResultT::storage_t> y;
    for (decltype(rs.size()) i = 0; i < rs.size(); i++)
    {
        x.push_back(rs[i].description);
        y.push_back(valueFunc(rs[i]));
    }
    p.drawBoxes(x, y).fillSolid();
    return p;
}